

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromFileDescriptor(MessageLite *this,int file_descriptor)

{
  bool bVar1;
  FileInputStream input;
  
  io::FileInputStream::FileInputStream(&input,file_descriptor,-1);
  bVar1 = ParsePartialFromZeroCopyStream(this,&input.super_ZeroCopyInputStream);
  io::FileInputStream::~FileInputStream(&input);
  return bVar1 && input.copying_input_.errno_ == 0;
}

Assistant:

bool MessageLite::ParsePartialFromFileDescriptor(int file_descriptor) {
  io::FileInputStream input(file_descriptor);
  return ParsePartialFromZeroCopyStream(&input) && input.GetErrno() == 0;
}